

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::CommandQueueVkImpl::~CommandQueueVkImpl(CommandQueueVkImpl *this)

{
  FenceVkImpl *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer ppVVar2;
  
  this_00 = (this->m_pFence).m_pObject;
  if (this_00 != (FenceVkImpl *)0x0) {
    FenceVkImpl::ImmediatelyReleaseResources(this_00);
  }
  RefCntAutoPtr<Diligent::FenceVkImpl>::Release(&this->m_pFence);
  p_Var1 = (this->m_LastSyncPoint).
           super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_LastSyncPoint).super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_LastSyncPoint).super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_SyncPointAllocator);
  p_Var1 = (this->m_SyncObjectManager).
           super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->m_LastSyncPoint).
           super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  ppVVar2 = (this->m_TempSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar2 != (pointer)0x0) {
    operator_delete(ppVVar2,(long)(this->m_TempSignalSemaphores).
                                  super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar2
                   );
  }
  RefCntAutoPtr<Diligent::FenceVkImpl>::Release(&this->m_pFence);
  p_Var1 = (this->m_LogicalDevice).
           super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

CommandQueueVkImpl::~CommandQueueVkImpl()
{
    // Fence have resources that will be added to release queue.
    // But release queue will be destroyed after command queue and it will not release new resources.
    if (m_pFence)
        m_pFence->ImmediatelyReleaseResources();

    m_pFence.Release();
    m_LastSyncPoint.reset();

    // Queues are created along with the logical device during vkCreateDevice.
    // All queues associated with the logical device are destroyed when vkDestroyDevice
    // is called on that device.
}